

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void __thiscall
fill<128U,_3U,_buffer_layout_bfs>::operator()
          (fill<128U,_3U,_buffer_layout_bfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  long lVar1;
  size_t from0;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  value_type vVar5;
  array<unsigned_long,_128UL> *buffer_count_local;
  uchar **buffer_local;
  array<Stream,_128UL> *streams_local;
  fill<128U,_3U,_buffer_layout_bfs> *this_local;
  uchar **resultbuf_2;
  uchar **l_1;
  size_t lcount_1;
  uchar **newbegin_1;
  uchar **begin_1;
  uchar **local_b8;
  uchar **resultbuf_1;
  uchar **r_1;
  size_t rcount_1;
  uchar **newbegin;
  uchar **begin;
  uchar **local_88;
  uchar **resultbuf;
  uchar **r;
  uchar **l;
  size_t rcount;
  size_t lcount;
  fill<128U,_6U,_buffer_layout_bfs> local_49;
  long local_48;
  size_t need;
  DI __d;
  
  __d.i = (string *)buffer_count;
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"fill_inner");
  poVar3 = std::operator<<(poVar3,", inner, I=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
  std::operator<<(poVar3,"\n");
  fill_inner<128u,3u,buffer_layout_bfs>(std::array<Stream,128u>&,unsigned_char**,std::
  array<unsigned_long,128u>&,std::integral_constant<bool,true>)::DI::DI(std::__cxx11::string__
            (&need,(string *)__debug_indent_str_abi_cxx11_);
  local_48 = 8;
  do {
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,6);
    if (*pvVar4 == 0) {
      fill<128U,_6U,_buffer_layout_bfs>::operator()
                (&local_49,streams,buffer,(array<unsigned_long,_128UL> *)__d.i);
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,6);
      if (*pvVar4 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar3,"left stream drained\n");
        goto LAB_001a3e29;
      }
    }
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,7);
    if (*pvVar4 == 0) {
      fill<128U,_7U,_buffer_layout_bfs>::operator()
                ((fill<128U,_7U,_buffer_layout_bfs> *)((long)&lcount + 3),streams,buffer,
                 (array<unsigned_long,_128UL> *)__d.i);
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,7);
      if (*pvVar4 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar3,"right stream drained\n");
        goto LAB_001a40aa;
      }
    }
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,6);
    rcount = *pvVar4;
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,7);
    l = (uchar **)*pvVar4;
    r = buffer + (0xd0 - rcount);
    resultbuf = buffer + (0x110 - (long)l);
    local_88 = buffer + (0x10 - local_48);
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"L:\'");
    poVar3 = std::operator<<(poVar3,*r);
    poVar3 = std::operator<<(poVar3,"\', R:\'");
    poVar3 = std::operator<<(poVar3,*resultbuf);
    std::operator<<(poVar3,"\'\n");
    iVar2 = cmp(*r,*resultbuf);
    if (iVar2 < 1) {
      *local_88 = *r;
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,6);
      *pvVar4 = *pvVar4 - 1;
    }
    else {
      *local_88 = *resultbuf;
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,7);
      *pvVar4 = *pvVar4 - 1;
    }
    check_input(buffer + 8,8 - local_48);
    local_48 = local_48 + -1;
  } while (local_48 != 0);
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar3,"Done, buffer filled\n");
  pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,3);
  *pvVar4 = 8;
  goto LAB_001a4311;
LAB_001a3e29:
  do {
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,7);
    if (*pvVar4 == 0) {
      fill<128U,_7U,_buffer_layout_bfs>::operator()
                ((fill<128U,_7U,_buffer_layout_bfs> *)((long)&begin + 3),streams,buffer,
                 (array<unsigned_long,_128UL> *)__d.i);
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,7);
      if (*pvVar4 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar3,"both streams prematurely drained\n");
        newbegin = buffer + 8;
        rcount_1 = (size_t)(buffer + local_48 + 8);
        memmove((void *)rcount_1,newbegin,(8 - local_48) * 8);
        vVar5 = 8 - local_48;
        pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                           ((array<unsigned_long,_128UL> *)__d.i,3);
        from0 = rcount_1;
        *pvVar4 = vVar5;
        pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                           ((array<unsigned_long,_128UL> *)__d.i,3);
        check_input((uchar **)from0,*pvVar4);
        goto LAB_001a4311;
      }
    }
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,7);
    r_1 = (uchar **)*pvVar4;
    resultbuf_1 = buffer + (0x110 - (long)r_1);
    local_b8 = buffer + (0x10 - local_48);
    *local_b8 = *resultbuf_1;
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,7);
    *pvVar4 = *pvVar4 - 1;
    local_48 = local_48 + -1;
  } while (local_48 != 0);
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar3,"\tbuffer filled\n");
  pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,3);
  *pvVar4 = 8;
  pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,3);
  check_input(buffer + 8,*pvVar4);
  goto LAB_001a4311;
LAB_001a40aa:
  do {
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,6);
    if (*pvVar4 == 0) {
      fill<128U,_6U,_buffer_layout_bfs>::operator()
                ((fill<128U,_6U,_buffer_layout_bfs> *)((long)&begin_1 + 7),streams,buffer,
                 (array<unsigned_long,_128UL> *)__d.i);
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,6);
      if (*pvVar4 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar3,"both streams prematurely drained\n");
        lVar1 = local_48 + 8;
        memmove(buffer + lVar1,buffer + 8,(8 - local_48) * 8);
        vVar5 = 8 - local_48;
        pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                           ((array<unsigned_long,_128UL> *)__d.i,3);
        *pvVar4 = vVar5;
        pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                           ((array<unsigned_long,_128UL> *)__d.i,3);
        check_input(buffer + lVar1,*pvVar4);
        goto LAB_001a4311;
      }
    }
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,6);
    buffer[0x10 - local_48] = buffer[0xd0 - *pvVar4];
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,6);
    *pvVar4 = *pvVar4 - 1;
    local_48 = local_48 + -1;
  } while (local_48 != 0);
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar3,"buffer filled\n");
  pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,3);
  *pvVar4 = 8;
  pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,3);
  check_input(buffer + 8,*pvVar4);
LAB_001a4311:
  begin._4_4_ = 1;
  anon_func::DI::~DI((DI *)&need);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}